

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ResultBuilder::captureExpectedException
          (ResultBuilder *this,
          Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *matcher)

{
  byte bVar1;
  long *in_RSI;
  long in_RDI;
  AssertionResult result;
  string actualMessage;
  AssertionResultData data;
  AssertionResult *this_00;
  AssertionResultData *in_stack_fffffffffffffec0;
  AssertionInfo *in_stack_fffffffffffffec8;
  AssertionResult *in_stack_fffffffffffffed0;
  AssertionResult *in_stack_fffffffffffffed8;
  ResultBuilder *in_stack_fffffffffffffee0;
  string local_88 [48];
  undefined1 local_58 [88];
  
  if ((*(byte *)(in_RDI + 0xb8) & 1) == 0) {
    this_00 = (AssertionResult *)local_58;
    local_58._72_8_ = in_RSI;
    AssertionResultData::AssertionResultData
              ((AssertionResultData *)in_stack_fffffffffffffed0,
               (AssertionResultData *)in_stack_fffffffffffffec8);
    local_58._64_4_ = 0;
    std::__cxx11::string::operator=((string *)this_00,(string *)(in_RDI + 0x48));
    translateActiveException_abi_cxx11_();
    bVar1 = (**(code **)(*(long *)local_58._72_8_ + 0x28))(local_58._72_8_,local_88);
    if ((bVar1 & 1) == 0) {
      local_58._64_4_ = 0x11;
      std::__cxx11::string::operator=((string *)local_58,local_88);
    }
    AssertionResult::AssertionResult
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    handleResult(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    AssertionResult::~AssertionResult(this_00);
    std::__cxx11::string::~string(local_88);
    AssertionResultData::~AssertionResultData((AssertionResultData *)this_00);
    return;
  }
  __assert_fail("m_exprComponents.testFalse == false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]arena_allocator/test/catch.hpp"
                ,0x1f26,
                "void Catch::ResultBuilder::captureExpectedException(const Matchers::Impl::Matcher<std::string> &)"
               );
}

Assistant:

void ResultBuilder::captureExpectedException( Matchers::Impl::Matcher<std::string> const& matcher ) {

        assert( m_exprComponents.testFalse == false );
        AssertionResultData data = m_data;
        data.resultType = ResultWas::Ok;
        data.reconstructedExpression = m_assertionInfo.capturedExpression;

        std::string actualMessage = Catch::translateActiveException();
        if( !matcher.match( actualMessage ) ) {
            data.resultType = ResultWas::ExpressionFailed;
            data.reconstructedExpression = actualMessage;
        }
        AssertionResult result( m_assertionInfo, data );
        handleResult( result );
    }